

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O0

int collect_addr_uses(gen_ctx_t gen_ctx,bb_insn_t_conflict bb_insn,VARR_bb_insn_t *bb_mem_insns)

{
  int iVar1;
  long *local_30;
  ssa_edge_t_conflict se;
  int res;
  VARR_bb_insn_t *bb_mem_insns_local;
  bb_insn_t_conflict bb_insn_local;
  gen_ctx_t gen_ctx_local;
  
  se._4_4_ = 1;
  iVar1 = MIR_addr_code_p((MIR_insn_code_t)*(undefined8 *)&bb_insn->insn->field_0x18);
  if ((iVar1 == 0) && (iVar1 = move_p(bb_insn->insn), iVar1 == 0)) {
    __assert_fail("MIR_addr_code_p (bb_insn->insn->code) || move_p (bb_insn->insn)",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                  ,0xb15,"int collect_addr_uses(gen_ctx_t, bb_insn_t, VARR_bb_insn_t *)");
  }
  local_30 = (long *)bb_insn->insn->ops[0].data;
  do {
    if (local_30 == (long *)0x0) {
      return se._4_4_;
    }
    if ((*(ushort *)(*(long *)*local_30 + (ulong)*(uint *)((long)local_30 + 0x14) * 0x30 + 0x28) &
        0xff) == 0xb) {
      iVar1 = move_code_p((MIR_insn_code_t)*(undefined8 *)(*(long *)*local_30 + 0x18));
      if ((iVar1 == 0) || (1 < *(uint *)((long)local_30 + 0x14))) {
        __assert_fail("move_code_p (se->use->insn->code) && se->use_op_num <= 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                      ,0xb18,"int collect_addr_uses(gen_ctx_t, bb_insn_t, VARR_bb_insn_t *)");
      }
      if (bb_mem_insns != (VARR_bb_insn_t *)0x0) {
        VARR_bb_insn_tpush(bb_mem_insns,(bb_insn_t_conflict)*local_30);
      }
    }
    else {
      iVar1 = move_p(*(MIR_insn_t *)*local_30);
      if (iVar1 == 0) {
        se._4_4_ = 0;
      }
      else {
        iVar1 = bitmap_set_bit_p(gen_ctx->temp_bitmap2,(ulong)*(uint *)(*local_30 + 0xc));
        if (iVar1 != 0) {
          VARR_bb_insn_tpush(gen_ctx->temp_bb_insns2,(bb_insn_t_conflict)*local_30);
        }
      }
    }
    local_30 = (long *)local_30[4];
  } while( true );
}

Assistant:

static int collect_addr_uses (gen_ctx_t gen_ctx, bb_insn_t bb_insn,
                              VARR (bb_insn_t) * bb_mem_insns) {
  int res = TRUE;

  gen_assert (MIR_addr_code_p (bb_insn->insn->code) || move_p (bb_insn->insn));
  for (ssa_edge_t se = bb_insn->insn->ops[0].data; se != NULL; se = se->next_use) {
    if (se->use->insn->ops[se->use_op_num].mode == MIR_OP_VAR_MEM) {
      gen_assert (move_code_p (se->use->insn->code) && se->use_op_num <= 1);
      if (bb_mem_insns != NULL) VARR_PUSH (bb_insn_t, bb_mem_insns, se->use);
      continue;
    }
    if (!move_p (se->use->insn)) {
      res = FALSE;
    } else if (bitmap_set_bit_p (temp_bitmap2, se->use->index)) {
      VARR_PUSH (bb_insn_t, temp_bb_insns2, se->use);
    }
  }
  return res;
}